

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_record.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  char *format;
  int iVar15;
  ulong uVar16;
  float fVar17;
  undefined4 uVar18;
  float in_XMM1_Da;
  undefined4 uVar19;
  float fVar20;
  ALLEGRO_PATH *tmp_path;
  ALLEGRO_EVENT e;
  long local_d0;
  ulong local_c8;
  long local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  int local_78 [9];
  int local_54;
  
  local_d0 = 0;
  cVar4 = al_install_system(0x85020700,atexit);
  if (cVar4 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    cVar4 = al_init_primitives_addon();
    if (cVar4 == '\0') {
      format = "Unable to initialize primitives addon";
    }
    else {
      cVar4 = al_install_keyboard();
      if (cVar4 == '\0') {
        format = "Unable to install keyboard";
      }
      else {
        cVar4 = al_install_audio();
        if (cVar4 == '\0') {
          format = "Unable to initialize audio addon";
        }
        else {
          cVar4 = al_init_acodec_addon();
          if (cVar4 == '\0') {
            format = "Unable to initialize acodec addon";
          }
          else {
            lVar7 = al_create_audio_recorder(1000,0x500,0x5622,8,0x10);
            if (lVar7 == 0) {
              format = "Unable to create audio recorder";
            }
            else {
              lVar8 = al_create_audio_stream(4,0x1000,0x5622,8,0x10);
              if (lVar8 == 0) {
                format = "Unable to create audio stream";
              }
              else {
                local_c8 = 0;
                al_reserve_samples(0);
                al_set_audio_stream_playing(lVar8,0);
                uVar9 = al_get_default_mixer();
                al_attach_audio_stream_to_mixer(lVar8,uVar9);
                uVar9 = al_create_event_queue();
                al_set_new_display_option(0x11,1,2);
                al_set_new_display_option(0x12,8,2);
                lVar10 = al_create_display(0x140,0x100);
                if (lVar10 != 0) {
                  al_set_window_title(lVar10,"SPACE to record. P to playback.");
                  uVar11 = al_get_audio_recorder_event_source(lVar7);
                  al_register_event_source(uVar9,uVar11);
                  uVar11 = al_get_audio_stream_event_source(lVar8);
                  al_register_event_source(uVar9,uVar11);
                  uVar11 = al_get_display_event_source(lVar10);
                  al_register_event_source(uVar9,uVar11);
                  uVar11 = al_get_keyboard_event_source();
                  al_register_event_source(uVar9,uVar11);
                  local_a0 = lVar7;
                  al_start_audio_recorder(lVar7);
                  bVar3 = false;
                  iVar6 = 0;
                  lVar7 = 0;
                  local_a8 = uVar9;
                  local_98 = lVar8;
                  do {
                    al_wait_for_event(uVar9,local_78);
                    if (local_78[0] < 0x201) {
                      if (local_78[0] == 0xb) {
                        if (local_54 != 0x1b) {
                          if (local_54 == 0x70) {
                            if (local_d0 != 0 && !bVar3) {
                              uVar11 = al_path_cstr(local_d0,0x2f);
                              lVar7 = al_fopen(uVar11,"r");
                              if (lVar7 == 0) goto LAB_00102b12;
                              al_set_audio_stream_playing(lVar8,1);
                            }
                          }
                          else if (local_54 == 0x20) {
                            if (bVar3) {
                              if (lVar7 != 0) {
                                al_fclose(lVar7);
                              }
                              bVar3 = false;
LAB_00102b12:
                              lVar7 = 0;
                            }
                            else {
                              cVar4 = al_get_audio_stream_playing(lVar8);
                              if (cVar4 != '\0') {
                                al_drain_audio_stream(lVar8);
                              }
                              if (local_d0 == 0) {
                                lVar7 = al_make_temp_file("alrecXXX.raw",&local_d0);
                              }
                              else {
                                if (lVar7 != 0) {
                                  al_fclose(lVar7);
                                }
                                uVar11 = al_path_cstr(local_d0,0x2f);
                                lVar7 = al_fopen(uVar11,"w");
                              }
                              bVar3 = true;
                              local_c8 = 0;
                            }
                          }
                          goto LAB_00102b15;
                        }
                      }
                      else if (local_78[0] != 0x2a) goto LAB_00102b15;
                      bVar2 = false;
                    }
                    else {
                      if (local_78[0] == 0x201) {
                        if (lVar7 == 0) goto LAB_00102b12;
                        lVar10 = al_get_audio_stream_fragment(lVar8);
                        if (lVar10 != 0) {
                          uVar16 = 0;
                          do {
                            lVar12 = al_fread(lVar7,lVar10 + uVar16,0x1000 - uVar16);
                            uVar16 = lVar12 + uVar16;
                            if ((0xfff < uVar16) || (cVar4 = al_feof(lVar7), cVar4 != '\0')) break;
                            iVar5 = al_ferror(lVar7);
                          } while (iVar5 == 0);
                          if (uVar16 < 0x1000) {
                            memset((void *)(lVar10 + uVar16),0x80,0x1000 - uVar16);
                          }
                          al_set_audio_stream_fragment(lVar8,lVar10);
                          iVar5 = al_ferror(lVar7);
                          uVar9 = local_a8;
                          if ((iVar5 != 0) || (cVar4 = al_feof(lVar7), cVar4 != '\0')) {
                            al_drain_audio_stream(lVar8);
                            al_fclose(lVar7);
                            lVar7 = 0;
                          }
                        }
                      }
                      else if (local_78[0] == 0x203) {
                        local_c0 = lVar7;
                        lVar10 = al_get_audio_recorder_event(local_78);
                        lVar7 = *(long *)(lVar10 + 0x20);
                        iVar5 = *(int *)(lVar10 + 0x28);
                        lVar10 = (long)iVar5;
                        if (lVar10 < 1) {
                          fVar17 = 0.0;
                        }
                        else {
                          lVar12 = 0;
                          iVar15 = 0;
                          do {
                            iVar14 = *(byte *)(lVar7 + lVar12) - 0x80;
                            iVar13 = -iVar14;
                            if (0 < iVar14) {
                              iVar13 = iVar14;
                            }
                            if (iVar13 < iVar15) {
                              iVar13 = iVar15;
                            }
                            iVar15 = iVar13;
                            lVar12 = lVar12 + 1;
                          } while (lVar10 != lVar12);
                          fVar17 = (float)iVar15;
                        }
                        al_map_rgb(0,0,0);
                        al_clear_to_color();
                        if (bVar3) {
                          if ((local_c0 != 0) && (iVar15 = (int)local_c8, iVar15 < 0x1430)) {
                            al_fwrite(local_c0,lVar7,lVar10);
                            local_c8 = (ulong)(iVar15 + 1);
                          }
                          uVar1 = iVar5 / 0x140;
                          local_80 = (ulong)uVar1;
                          local_88 = (long)(int)uVar1;
                          lVar12 = 0;
                          iVar15 = 0;
                          iVar5 = iVar6;
                          local_90 = lVar10;
                          do {
                            lVar8 = local_88;
                            iVar14 = iVar15 * (int)local_80;
                            iVar13 = iVar14 + (int)local_80;
                            if ((int)local_90 <= iVar13) {
                              iVar13 = (int)local_90;
                            }
                            iVar6 = 0;
                            if (iVar14 < iVar13) {
                              iVar6 = 0;
                              lVar10 = lVar12;
                              do {
                                iVar6 = iVar6 + (uint)*(byte *)(lVar7 + lVar10) + -0x80;
                                lVar10 = lVar10 + 1;
                              } while (lVar10 < iVar13);
                            }
                            iVar6 = iVar6 / (int)local_88;
                            local_ac = (float)(iVar15 + -1);
                            uVar19 = 0x43800000;
                            local_b0 = (float)iVar15;
                            local_b4 = ((float)(iVar5 + 0x80) / 255.0) * 256.0 + 128.0 + -128.0;
                            local_b8 = ((float)(iVar6 + 0x80) / 255.0) * 256.0 + 128.0 + -128.0;
                            uVar18 = al_map_rgb(0xff,0xff,0xff);
                            in_XMM1_Da = local_b4;
                            al_draw_line(local_ac,local_b4,local_b0,local_b8,uVar18,uVar19,
                                         0x3f99999a);
                            iVar15 = iVar15 + 1;
                            lVar12 = lVar12 + lVar8;
                            lVar8 = local_98;
                            uVar9 = local_a8;
                            iVar5 = iVar6;
                          } while (iVar15 != 0x140);
                        }
                        uVar18 = al_map_rgba(0,0xff,0);
                        fVar20 = 251.0;
                        al_draw_filled_rectangle
                                  ((fVar17 / 127.0) * 320.0,0x437b0000,0,0x43800000,uVar18,
                                   in_XMM1_Da);
                        al_flip_display();
                        lVar7 = local_c0;
                        in_XMM1_Da = fVar20;
                      }
LAB_00102b15:
                      bVar2 = true;
                    }
                    if (!bVar2) {
                      al_destroy_audio_recorder(local_a0);
                      al_destroy_audio_stream(lVar8);
                      if (lVar7 != 0) {
                        al_fclose(lVar7);
                      }
                      if (local_d0 != 0) {
                        uVar9 = al_path_cstr(local_d0,0x2f);
                        al_remove_filename(uVar9);
                        al_destroy_path(local_d0);
                      }
                      return 0;
                    }
                  } while( true );
                }
                format = "Error creating display\n";
              }
            }
          }
        }
      }
    }
  }
  abort_example(format);
  iVar6 = __cxa_atexit();
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_AUDIO_RECORDER *r;
   ALLEGRO_AUDIO_STREAM *s;
   
   ALLEGRO_EVENT_QUEUE *q;
   ALLEGRO_DISPLAY *d;
   ALLEGRO_FILE *fp = NULL;
   ALLEGRO_PATH *tmp_path = NULL;
      
   int prev = 0;
   bool is_recording = false;
   
   int n = 0; /* number of samples written to disk */
   
   (void) argc;
   (void) argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   if (!al_init_primitives_addon()) {
      abort_example("Unable to initialize primitives addon");
   }
      
   if (!al_install_keyboard()) {
      abort_example("Unable to install keyboard");
   }
      
   if (!al_install_audio()) {
      abort_example("Unable to initialize audio addon");
   }
   
   if (!al_init_acodec_addon()) {
      abort_example("Unable to initialize acodec addon");
   }
   
   /* Note: increasing the number of channels will break this demo. Other
    * settings can be changed by modifying the constants at the top of the
    * file.
    */
   r = al_create_audio_recorder(1000, samples_per_fragment, frequency,
      audio_depth, ALLEGRO_CHANNEL_CONF_1);
   if (!r) {
      abort_example("Unable to create audio recorder");
   }
   
   s = al_create_audio_stream(playback_fragment_count,
      playback_samples_per_fragment, frequency, audio_depth,
      ALLEGRO_CHANNEL_CONF_1);      
   if (!s) {
      abort_example("Unable to create audio stream");
   }
      
   al_reserve_samples(0);
   al_set_audio_stream_playing(s, false);
   al_attach_audio_stream_to_mixer(s, al_get_default_mixer());
      
   q = al_create_event_queue();
   
   /* Note: the following two options are referring to pixel samples, and have
    * nothing to do with audio samples. */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   
   d = al_create_display(320, 256);
   if (!d) {
      abort_example("Error creating display\n");
   }
      
   al_set_window_title(d, "SPACE to record. P to playback.");
   
   al_register_event_source(q, al_get_audio_recorder_event_source(r));
   al_register_event_source(q, al_get_audio_stream_event_source(s));
   al_register_event_source(q, al_get_display_event_source(d));
   al_register_event_source(q, al_get_keyboard_event_source());
   
   al_start_audio_recorder(r);
   
   while (true) {
      ALLEGRO_EVENT e;

      al_wait_for_event(q, &e);
       
      if (e.type == ALLEGRO_EVENT_AUDIO_RECORDER_FRAGMENT) {
         /* We received an incoming fragment from the microphone. In this
          * example, the recorder is constantly recording even when we aren't
          * saving to disk. The display is updated every time a new fragment
          * comes in, because it makes things more simple. If the fragments
          * are coming in faster than we can update the screen, then it will be
          * a problem.
          */          
         ALLEGRO_AUDIO_RECORDER_EVENT *re = al_get_audio_recorder_event(&e);
         audio_buffer_t input = (audio_buffer_t) re->buffer;
         int sample_count = re->samples; 
         const int R = sample_count / 320;
         int i, gain = 0;
         
         /* Calculate the volume, and display it regardless if we are actively
          * recording to disk. */
         for (i = 0; i < sample_count; ++i) {
            if (gain < abs(input[i] - sample_center))
               gain = abs(input[i] - sample_center);
         }
        
         al_clear_to_color(al_map_rgb(0,0,0));
        
         if (is_recording) {
            /* Save raw bytes to disk. Assumes everything is written
             * succesfully. */
            if (fp && n < frequency / (float) samples_per_fragment * 
               max_seconds_to_record) {
               al_fwrite(fp, input, sample_count * sample_size);
               ++n;
            }

            /* Draw a pathetic visualization. It draws exactly one fragment
             * per frame. This means the visualization is dependent on the 
             * various parameters. A more thorough implementation would use this
             * event to copy the new data into a circular buffer that holds a
             * few seconds of audio. The graphics routine could then always
             * draw that last second of audio, which would cause the
             * visualization to appear constant across all different settings.
             */
            for (i = 0; i < 320; ++i) {
               int j, c = 0;
               
               /* Take the average of R samples so it fits on the screen */
               for (j = i * R; j < i * R + R && j < sample_count; ++j) {
                  c += input[j] - sample_center;
               }
               c /= R;
               
               /* Draws a line from the previous sample point to the next */
               al_draw_line(i - 1, 128 + ((prev - min_sample_val) /
                  (float) sample_range) * 256 - 128, i, 128 +
                  ((c - min_sample_val) / (float) sample_range) * 256 - 128,
                  al_map_rgb(255,255,255), 1.2);
               
               prev = c;
            }
         }
         
         /* draw volume bar */
         al_draw_filled_rectangle((gain / (float) max_sample_val) * 320, 251,
            0, 256, al_map_rgba(0, 255, 0, 128));
            
         al_flip_display();
      }
      else if (e.type == ALLEGRO_EVENT_AUDIO_STREAM_FRAGMENT) {
         /* This event is received when we are playing back the audio clip.
          * See ex_saw.c for an example dedicated to playing streams.
          */
         if (fp) {
            audio_buffer_t output = al_get_audio_stream_fragment(s);
            if (output) {
               /* Fill the buffer from the data we have recorded into the file.
                * If an error occurs (or end of file) then silence out the
                * remainder of the buffer and stop the playback.
                */
               const size_t bytes_to_read =
                  playback_samples_per_fragment * sample_size;
               size_t bytes_read = 0, i;
               
               do {
                  bytes_read += al_fread(fp, (uint8_t *)output + bytes_read,
                     bytes_to_read - bytes_read);                  
               } while (bytes_read < bytes_to_read && !al_feof(fp) &&
                  !al_ferror(fp));
               
               /* silence out unused part of buffer (end of file) */
               for (i = bytes_read / sample_size;
                  i < bytes_to_read / sample_size; ++i) {
                     output[i] = sample_center;
               }
               
               al_set_audio_stream_fragment(s, output);
               
               if (al_ferror(fp) || al_feof(fp)) {
                  al_drain_audio_stream(s);
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
      }      
      else if (e.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (e.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (e.keyboard.unichar == 27) {
            /* pressed ESC */
            break;
         }
         else if (e.keyboard.unichar == ' ') {
            if (!is_recording) {
               /* Start the recording */
               is_recording = true;
               
               if (al_get_audio_stream_playing(s)) {
                  al_drain_audio_stream(s);
               }
               
               /* Reuse the same temp file for all recordings */
               if (!tmp_path) {
                  fp = al_make_temp_file("alrecXXX.raw", &tmp_path);
               }
               else {
                  if (fp) al_fclose(fp);
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "w");
               }
               
               n = 0;
            }
            else {
               is_recording = false;
               if (fp) {
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
         else if (e.keyboard.unichar == 'p') {
            /* Play the previously recorded wav file */
            if (!is_recording) {
               if (tmp_path) {
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "r");
                  if (fp) {
                     al_set_audio_stream_playing(s, true);
                  }
               }
            }
         }
      }
   }
   
   /* clean up */
   al_destroy_audio_recorder(r);
   al_destroy_audio_stream(s);
      
   if (fp)
      al_fclose(fp);
      
   if (tmp_path) {
      al_remove_filename(al_path_cstr(tmp_path, '/'));
      al_destroy_path(tmp_path);
   }
   
   return 0;
}